

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixer_sse.cpp
# Opt level: O2

float * Resample_<FastBSincTag,SSETag>
                  (InterpState *state,float *src,uint frac,uint increment,
                  span<float,_18446744073709551615UL> dst)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  iterator __begin1;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pfVar8 = dst.mData;
  pfVar6 = pfVar8;
  pfVar5 = (state->bsinc).filter;
  uVar4 = (state->bsinc).m;
  pfVar7 = src + -(ulong)(state->bsinc).l;
  for (; pfVar8 != dst.mDataEnd; pfVar8 = pfVar8 + 1) {
    fVar12 = (float)(frac & 0x7f) * 0.0078125;
    lVar11 = (ulong)(frac >> 7) * (ulong)uVar4 * 0x10;
    fVar13 = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar16 = 0.0;
    lVar9 = 0;
    uVar10 = (ulong)(uVar4 >> 2);
    do {
      pfVar1 = (float *)((long)pfVar5 + lVar9 + (ulong)uVar4 * 4 + lVar11);
      pfVar2 = (float *)((long)pfVar5 + lVar9 + lVar11);
      pfVar3 = (float *)((long)pfVar7 + lVar9);
      fVar13 = fVar13 + *pfVar3 * (*pfVar1 * fVar12 + *pfVar2);
      fVar14 = fVar14 + pfVar3[1] * (pfVar1[1] * fVar12 + pfVar2[1]);
      fVar15 = fVar15 + pfVar3[2] * (pfVar1[2] * fVar12 + pfVar2[2]);
      fVar16 = fVar16 + pfVar3[3] * (pfVar1[3] * fVar12 + pfVar2[3]);
      lVar9 = lVar9 + 0x10;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    *pfVar8 = fVar14 + fVar15 + fVar16 + fVar13;
    pfVar7 = pfVar7 + (frac + increment >> 0xc);
    frac = frac + increment & 0xfff;
  }
  return pfVar6;
}

Assistant:

const float *Resample_<FastBSincTag,SSETag>(const InterpState *state, const float *RESTRICT src,
    uint frac, uint increment, const al::span<float> dst)
{
    const float *const filter{state->bsinc.filter};
    const size_t m{state->bsinc.m};

    src -= state->bsinc.l;
    for(float &out_sample : dst)
    {
        // Calculate the phase index and factor.
        const uint pi{frac >> FracPhaseBitDiff};
        const float pf{static_cast<float>(frac & (FracPhaseDiffOne-1)) * (1.0f/FracPhaseDiffOne)};

        // Apply the phase interpolated filter.
        __m128 r4{_mm_setzero_ps()};
        {
            const __m128 pf4{_mm_set1_ps(pf)};
            const float *fil{filter + m*pi*4};
            const float *phd{fil + m};
            size_t td{m >> 2};
            size_t j{0u};

            do {
                /* f = fil + pf*phd */
                const __m128 f4 = MLA4(_mm_load_ps(&fil[j]), pf4, _mm_load_ps(&phd[j]));
                /* r += f*src */
                r4 = MLA4(r4, f4, _mm_loadu_ps(&src[j]));
                j += 4;
            } while(--td);
        }
        r4 = _mm_add_ps(r4, _mm_shuffle_ps(r4, r4, _MM_SHUFFLE(0, 1, 2, 3)));
        r4 = _mm_add_ps(r4, _mm_movehl_ps(r4, r4));
        out_sample = _mm_cvtss_f32(r4);

        frac += increment;
        src  += frac>>MixerFracBits;
        frac &= MixerFracMask;
    }
    return dst.data();
}